

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.cpp
# Opt level: O0

void __thiscall Node::printOutcomingEdges(Node *this,ostream *ostream)

{
  bool bVar1;
  ostream *poVar2;
  ostream *poVar3;
  ostream *in_RSI;
  long in_RDI;
  Node **successor;
  iterator __end1;
  iterator __begin1;
  set<Node_*,_std::less<Node_*>,_std::allocator<Node_*>_> *__range1;
  set<Node_*,_std::less<Node_*>,_std::allocator<Node_*>_> *in_stack_ffffffffffffff78;
  string local_70 [24];
  Node *in_stack_ffffffffffffffa8;
  string local_50 [32];
  reference local_30;
  _Self local_28;
  _Self local_20;
  long local_18;
  ostream *local_10;
  
  local_18 = in_RDI + 0x50;
  local_10 = in_RSI;
  local_20._M_node =
       (_Base_ptr)
       std::set<Node_*,_std::less<Node_*>,_std::allocator<Node_*>_>::begin
                 (in_stack_ffffffffffffff78);
  local_28._M_node =
       (_Base_ptr)
       std::set<Node_*,_std::less<Node_*>,_std::allocator<Node_*>_>::end(in_stack_ffffffffffffff78);
  while( true ) {
    bVar1 = std::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    local_30 = std::_Rb_tree_const_iterator<Node_*>::operator*
                         ((_Rb_tree_const_iterator<Node_*> *)0x186f6a);
    poVar2 = local_10;
    dotName_abi_cxx11_(in_stack_ffffffffffffffa8);
    poVar2 = std::operator<<(poVar2,local_50);
    poVar2 = std::operator<<(poVar2," -> ");
    dotName_abi_cxx11_(in_stack_ffffffffffffffa8);
    poVar3 = std::operator<<(poVar2,local_70);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::~string(local_70);
    std::__cxx11::string::~string(local_50);
    std::_Rb_tree_const_iterator<Node_*>::operator++((_Rb_tree_const_iterator<Node_*> *)poVar2);
  }
  return;
}

Assistant:

void Node::printOutcomingEdges(ostream &ostream) const {
    for (const auto &successor : successors_) {
        ostream << this->dotName() << " -> " << successor->dotName() << "\n";
    }
}